

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis<double>
                 (size_t nrows,int *x,int ncat,size_t *buffer_cnt,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  double dVar4;
  
  lVar3 = (long)ncat;
  if (buffer_cnt + lVar3 + 1 != buffer_cnt) {
    memset(buffer_cnt,0,lVar3 * 8 + 8);
  }
  if (missing_action == Fail) {
    if (nrows != 0) {
      sVar2 = 0;
      do {
        buffer_cnt[x[sVar2]] = buffer_cnt[x[sVar2]] + 1;
        sVar2 = sVar2 + 1;
      } while (nrows != sVar2);
    }
  }
  else if (nrows != 0) {
    sVar2 = 0;
    do {
      lVar1 = (long)x[sVar2];
      if ((long)x[sVar2] < 0) {
        lVar1 = lVar3;
      }
      buffer_cnt[lVar1] = buffer_cnt[lVar1] + 1;
      sVar2 = sVar2 + 1;
    } while (nrows != sVar2);
  }
  dVar4 = calc_kurtosis_internal<double>
                    (nrows,x,ncat,buffer_cnt,buffer_prob,missing_action,cat_split_type,rnd_generator
                    );
  return dVar4;
}

Assistant:

double calc_kurtosis(size_t nrows, int x[], int ncat, size_t buffer_cnt[], double buffer_prob[],
                     MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator)
{
    size_t cnt = nrows;
    std::fill(buffer_cnt, buffer_cnt + ncat + 1, (size_t)0);

    if (missing_action == Fail)
    {
        for (size_t row = 0; row < nrows; row++)
            buffer_cnt[x[row]]++;
    }

    else
    {
        for (size_t row = 0; row < nrows; row++)
        {
            if (likely(x[row] >= 0))
                buffer_cnt[x[row]]++;
            else
                buffer_cnt[ncat]++;
        }
    }

    return calc_kurtosis_internal<ldouble_safe>(
                                  cnt, x, ncat, buffer_cnt, buffer_prob,
                                  missing_action, cat_split_type, rnd_generator);
}